

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O2

LY_ERR ly_dup_prefix_data(ly_ctx *ctx,LY_VALUE_FORMAT format,void *prefix_data,void **prefix_data_p)

{
  LY_ERR LVar1;
  undefined8 *object;
  char *pcVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong uVar5;
  long lVar6;
  size_t __size;
  long lVar7;
  LY_ERR LVar8;
  ly_set *ns_list;
  
  if (*prefix_data_p != (void *)0x0) {
    __assert_fail("!*prefix_data_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                  ,0x581,
                  "LY_ERR ly_dup_prefix_data(const struct ly_ctx *, LY_VALUE_FORMAT, const void *, void **)"
                 );
  }
  LVar8 = LY_SUCCESS;
  LVar1 = LY_SUCCESS;
  switch(format) {
  case LY_VALUE_CANON:
  case LY_VALUE_JSON:
  case LY_VALUE_LYB:
    if (prefix_data != (void *)0x0) {
      __assert_fail("!prefix_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                    ,0x5ad,
                    "LY_ERR ly_dup_prefix_data(const struct ly_ctx *, LY_VALUE_FORMAT, const void *, void **)"
                   );
    }
    prefix_data = (void *)0x0;
    LVar1 = LY_SUCCESS;
    break;
  case LY_VALUE_SCHEMA:
    break;
  case LY_VALUE_SCHEMA_RESOLVED:
    if (prefix_data == (void *)0x0) {
      __size = 8;
    }
    else {
      __size = *(long *)((long)prefix_data + -8) << 4 | 8;
    }
    lVar7 = 1;
    plVar4 = (long *)calloc(1,__size);
    if (plVar4 != (long *)0x0) {
      *prefix_data_p = plVar4 + 1;
      lVar6 = 8;
      do {
        if (prefix_data == (void *)0x0) {
          uVar5 = 0;
        }
        else {
          uVar5 = *(ulong *)((long)prefix_data + -8);
        }
        if (uVar5 <= lVar7 - 1U) {
          return LY_SUCCESS;
        }
        pcVar2 = *(char **)((long)prefix_data + lVar6 + -8);
        if (pcVar2 != (char *)0x0) {
          pcVar2 = strdup(pcVar2);
          *(char **)((long)plVar4 + lVar6) = pcVar2;
          if (pcVar2 == (char *)0x0) goto LAB_001274a7;
        }
        *(undefined8 *)((long)plVar4 + lVar6 + 8) = *(undefined8 *)((long)prefix_data + lVar6);
        *plVar4 = lVar7;
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x10;
      } while( true );
    }
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_dup_prefix_data");
    goto LAB_001274cd;
  case LY_VALUE_XML:
  case LY_VALUE_STR_NS:
    LVar1 = ly_set_new(&ns_list);
    if (LVar1 == LY_SUCCESS) {
      *prefix_data_p = ns_list;
      uVar5 = 0;
      do {
        if (*(uint *)((long)prefix_data + 4) <= uVar5) {
          return LY_SUCCESS;
        }
        object = (undefined8 *)calloc(1,0x18);
        if (object == (undefined8 *)0x0) break;
        LVar1 = ly_set_add(ns_list,object,'\x01',(uint32_t *)0x0);
        if (LVar1 != LY_SUCCESS) goto LAB_00127500;
        lVar7 = *(long *)((long)prefix_data + 8);
        puVar3 = *(undefined8 **)(lVar7 + uVar5 * 8);
        if ((char *)*puVar3 != (char *)0x0) {
          pcVar2 = strdup((char *)*puVar3);
          *object = pcVar2;
          if (pcVar2 == (char *)0x0) break;
          puVar3 = *(undefined8 **)(lVar7 + uVar5 * 8);
        }
        pcVar2 = strdup((char *)puVar3[1]);
        object[1] = pcVar2;
        uVar5 = uVar5 + 1;
      } while (pcVar2 != (char *)0x0);
      LVar1 = LY_EMEM;
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_dup_prefix_data");
    }
    goto LAB_00127500;
  default:
    goto switchD_00127313_default;
  }
switchD_00127313_caseD_1:
  LVar8 = LVar1;
  *prefix_data_p = prefix_data;
switchD_00127313_default:
  return LVar8;
LAB_001274a7:
  ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_dup_prefix_data");
LAB_001274cd:
  LVar1 = LY_EMEM;
LAB_00127500:
  ly_free_prefix_data(format,*prefix_data_p);
  prefix_data = (void *)0x0;
  goto switchD_00127313_caseD_1;
}

Assistant:

LY_ERR
ly_dup_prefix_data(const struct ly_ctx *ctx, LY_VALUE_FORMAT format, const void *prefix_data,
        void **prefix_data_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxml_ns *ns;
    struct lysc_prefix *prefixes = NULL, *orig_pref;
    struct ly_set *ns_list, *orig_ns;
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u;

    assert(!*prefix_data_p);

    switch (format) {
    case LY_VALUE_SCHEMA:
        *prefix_data_p = (void *)prefix_data;
        break;
    case LY_VALUE_SCHEMA_RESOLVED:
        /* copy all the value prefixes */
        orig_pref = (struct lysc_prefix *)prefix_data;
        LY_ARRAY_CREATE_GOTO(ctx, prefixes, LY_ARRAY_COUNT(orig_pref), ret, cleanup);
        *prefix_data_p = prefixes;

        LY_ARRAY_FOR(orig_pref, u) {
            if (orig_pref[u].prefix) {
                prefixes[u].prefix = strdup(orig_pref[u].prefix);
                LY_CHECK_ERR_GOTO(!prefixes[u].prefix, LOGMEM(ctx); ret = LY_EMEM, cleanup);
            }
            prefixes[u].mod = orig_pref[u].mod;
            LY_ARRAY_INCREMENT(prefixes);
        }
        break;
    case LY_VALUE_XML:
    case LY_VALUE_STR_NS:
        /* copy all the namespaces */
        LY_CHECK_GOTO(ret = ly_set_new(&ns_list), cleanup);
        *prefix_data_p = ns_list;

        orig_ns = (struct ly_set *)prefix_data;
        for (i = 0; i < orig_ns->count; ++i) {
            ns = calloc(1, sizeof *ns);
            LY_CHECK_ERR_GOTO(!ns, LOGMEM(ctx); ret = LY_EMEM, cleanup);
            LY_CHECK_GOTO(ret = ly_set_add(ns_list, ns, 1, NULL), cleanup);

            if (((struct lyxml_ns *)orig_ns->objs[i])->prefix) {
                ns->prefix = strdup(((struct lyxml_ns *)orig_ns->objs[i])->prefix);
                LY_CHECK_ERR_GOTO(!ns->prefix, LOGMEM(ctx); ret = LY_EMEM, cleanup);
            }
            ns->uri = strdup(((struct lyxml_ns *)orig_ns->objs[i])->uri);
            LY_CHECK_ERR_GOTO(!ns->uri, LOGMEM(ctx); ret = LY_EMEM, cleanup);
        }
        break;
    case LY_VALUE_CANON:
    case LY_VALUE_JSON:
    case LY_VALUE_LYB:
        assert(!prefix_data);
        *prefix_data_p = NULL;
        break;
    }

cleanup:
    if (ret) {
        ly_free_prefix_data(format, *prefix_data_p);
        *prefix_data_p = NULL;
    }
    return ret;
}